

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

Token * __thiscall inja::Lexer::scan_number(Token *__return_storage_ptr__,Lexer *this)

{
  uint uVar1;
  byte *pbVar2;
  size_t pos;
  
  pos = this->m_pos;
  while (pos < (this->m_in).size_) {
    pbVar2 = (byte *)nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                               (&this->m_in,pos);
    if (((int)(char)*pbVar2 - 0x3aU < 0xfffffff6) &&
       ((uVar1 = *pbVar2 - 0x2b, 0x3a < uVar1 ||
        ((0x40000000400000dU >> ((ulong)uVar1 & 0x3f) & 1) == 0)))) break;
    pos = this->m_pos + 1;
    this->m_pos = pos;
  }
  make_token(__return_storage_ptr__,this,Number);
  return __return_storage_ptr__;
}

Assistant:

Token scan_number() {
		for (;;) {
			if (m_pos >= m_in.size()) {
				break;
			}
			char ch = m_in[m_pos];
			// be very permissive in lexer (we'll catch errors when conversion happens)
			if (!std::isdigit(ch) && ch != '.' && ch != 'e' && ch != 'E' && ch != '+' && ch != '-') {
				break;
			}
			m_pos += 1;
		}
		return make_token(Token::Kind::Number);
	}